

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicMax::Run(BasicMax *this)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = Check(this,0x90d6,0,true);
  lVar2 = -1;
  if (bVar1) {
    bVar1 = Check(this,0x90d8,0,true);
    if (bVar1) {
      bVar1 = Check(this,0x90d9,0,true);
      if (bVar1) {
        bVar1 = Check(this,0x90d7,0,true);
        if (bVar1) {
          bVar1 = Check(this,0x90da,8,true);
          if (bVar1) {
            bVar1 = Check(this,0x90db,8,true);
            if (bVar1) {
              bVar1 = Check(this,0x90dc,8,true);
              if (bVar1) {
                bVar1 = Check(this,0x90de,0x1000000,true);
                if (bVar1) {
                  bVar1 = Check(this,0x90dd,8,true);
                  if (bVar1) {
                    bVar1 = Check(this,0x8f39,8,true);
                    if (bVar1) {
                      bVar1 = Check(this,0x90df,0x100,false);
                      lVar2 = (ulong)bVar1 - 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!Check(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, 0, true))
			return ERROR;
		if (!Check(GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, 0, true))
			return ERROR;
		if (!Check(GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, 0, true))
			return ERROR;
		if (!Check(GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, 0, true))
			return ERROR;
		if (!Check(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, 8, true))
			return ERROR;
		if (!Check(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, 8, true))
			return ERROR;
		if (!Check(GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS, 8, true))
			return ERROR;
		if (!Check(GL_MAX_SHADER_STORAGE_BLOCK_SIZE, 16777216 /* 2^24 */, true))
			return ERROR;
		if (!Check(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, 8, true))
			return ERROR;
		if (!Check(GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES, 8, true))
			return ERROR;
		if (!Check(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, 256, false))
			return ERROR;
		return NO_ERROR;
	}